

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)4>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  ushort uVar1;
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  Instr instr_00;
  RunResult RVar2;
  unsigned_short *puVar3;
  uint *puVar4;
  byte local_51;
  undefined1 auStack_50 [7];
  u8 i;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<unsigned_short,_(unsigned_char)__x04_> local_28;
  Simd<unsigned_short,_(unsigned_char)__x04_> val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  instr_00 = instr;
  result.v[2] = instr.op.enum_;
  result.v[3] = instr.kind;
  val.v = (unsigned_short  [4])out_trap;
  RVar2 = Load<wabt::interp::Simd<unsigned_short,(unsigned_char)4>>
                    (this,instr_00,&local_28,out_trap);
  if (RVar2 == Ok) {
    for (local_51 = 0; local_51 < 4; local_51 = local_51 + 1) {
      puVar3 = Simd<unsigned_short,_(unsigned_char)'\x04'>::operator[](&local_28,local_51);
      uVar1 = *puVar3;
      puVar4 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                         ((Simd<unsigned_int,_(unsigned_char)__x04_> *)auStack_50,local_51);
      *puVar4 = (uint)uVar1;
    }
    value.v[2] = result.v[0];
    value.v[3] = result.v[1];
    value.v[0] = auStack_50._0_4_;
    value.v[1] = stack0xffffffffffffffb4;
    Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}